

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceSystemMock.cpp
# Opt level: O0

void __thiscall ResourceSystemMock::~ResourceSystemMock(ResourceSystemMock *this)

{
  ResourceSystemMock *this_local;
  
  std::function<void_*(unsigned_long)>::operator=(&_reserve,(nullptr_t)0x0);
  std::function<void_(void_*)>::operator=(&_free,(nullptr_t)0x0);
  testing::internal::FunctionMocker<void_(void_*)>::~FunctionMocker
            (&this->gmockconst1_Resource_Free_12);
  testing::internal::FunctionMocker<void_*(unsigned_long)>::~FunctionMocker
            (&this->gmockconst1_Resource_Reserve_11);
  return;
}

Assistant:

ResourceSystemMock::~ResourceSystemMock()
{
	_reserve = {};
	_free = {};
}